

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O0

void Fra_FraigVerifyCounterEx(Fra_Man_t *p,Vec_Int_t *vCex)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  long *plVar10;
  int local_30;
  int local_2c;
  int c;
  int i;
  Aig_Obj_t **ppClass;
  Aig_Obj_t *pObj;
  Vec_Int_t *vCex_local;
  Fra_Man_t *p_local;
  
  iVar3 = Aig_ManCiNum(p->pManAig);
  iVar4 = Vec_IntSize(vCex);
  if (iVar3 != iVar4) {
    __assert_fail("Aig_ManCiNum(p->pManAig) == Vec_IntSize(vCex)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCore.c"
                  ,0xbe,"void Fra_FraigVerifyCounterEx(Fra_Man_t *, Vec_Int_t *)");
  }
  local_2c = 0;
  while( true ) {
    iVar3 = Vec_PtrSize(p->pManAig->vObjs);
    if (iVar3 <= local_2c) {
      pAVar8 = Aig_ManConst1(p->pManAig);
      *(ulong *)&pAVar8->field_0x18 = *(ulong *)&pAVar8->field_0x18 & 0xffffffffffffffdf | 0x20;
      for (local_2c = 0; iVar3 = Vec_PtrSize(p->pManAig->vCis), local_2c < iVar3;
          local_2c = local_2c + 1) {
        pvVar7 = Vec_PtrEntry(p->pManAig->vCis,local_2c);
        uVar6 = Vec_IntEntry(vCex,local_2c);
        *(ulong *)((long)pvVar7 + 0x18) =
             *(ulong *)((long)pvVar7 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar6 & 1) << 5;
      }
      for (local_2c = 0; iVar3 = Vec_PtrSize(p->pManAig->vObjs), local_2c < iVar3;
          local_2c = local_2c + 1) {
        pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,local_2c);
        if ((pAVar8 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar8), iVar3 != 0)) {
          pAVar9 = Aig_ObjFanin0(pAVar8);
          uVar2 = *(ulong *)&pAVar9->field_0x18;
          uVar6 = Aig_ObjFaninC0(pAVar8);
          pAVar9 = Aig_ObjFanin1(pAVar8);
          uVar1 = *(ulong *)&pAVar9->field_0x18;
          uVar5 = Aig_ObjFaninC1(pAVar8);
          *(ulong *)&pAVar8->field_0x18 =
               *(ulong *)&pAVar8->field_0x18 & 0xffffffffffffffdf |
               ((ulong)(((uint)(uVar2 >> 5) & 1 ^ uVar6) & ((uint)(uVar1 >> 5) & 1 ^ uVar5)) & 1) <<
               5;
        }
      }
      for (local_2c = 0; iVar3 = Vec_PtrSize(p->pManAig->vCos), local_2c < iVar3;
          local_2c = local_2c + 1) {
        pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCos,local_2c);
        pAVar9 = Aig_ObjFanin0(pAVar8);
        uVar2 = *(ulong *)&pAVar9->field_0x18;
        uVar6 = Aig_ObjFaninC0(pAVar8);
        *(ulong *)&pAVar8->field_0x18 =
             *(ulong *)&pAVar8->field_0x18 & 0xffffffffffffffdf |
             ((ulong)((uint)(uVar2 >> 5) & 1 ^ uVar6) & 1) << 5;
      }
      for (local_2c = 0; iVar3 = Vec_PtrSize(p->pCla->vClasses1), local_2c < iVar3;
          local_2c = local_2c + 1) {
        pvVar7 = Vec_PtrEntry(p->pCla->vClasses1,local_2c);
        if (((uint)(*(ulong *)((long)pvVar7 + 0x18) >> 3) & 1) !=
            ((uint)(*(ulong *)((long)pvVar7 + 0x18) >> 5) & 1)) {
          printf("The node %d is not constant under cex!\n",(ulong)*(uint *)((long)pvVar7 + 0x24));
        }
      }
      for (local_2c = 0; iVar3 = Vec_PtrSize(p->pCla->vClasses), local_2c < iVar3;
          local_2c = local_2c + 1) {
        plVar10 = (long *)Vec_PtrEntry(p->pCla->vClasses,local_2c);
        for (local_30 = 1; plVar10[local_30] != 0; local_30 = local_30 + 1) {
          if (((uint)(*(ulong *)(*plVar10 + 0x18) >> 3) & 1 ^
              (uint)(*(ulong *)(plVar10[local_30] + 0x18) >> 3) & 1) !=
              ((uint)(*(ulong *)(*plVar10 + 0x18) >> 5) & 1 ^
              (uint)(*(ulong *)(plVar10[local_30] + 0x18) >> 5) & 1)) {
            printf("The nodes %d and %d are not equal under cex!\n",
                   (ulong)*(uint *)(*plVar10 + 0x24),(ulong)*(uint *)(plVar10[local_30] + 0x24));
          }
        }
      }
      for (local_2c = 0; iVar3 = Vec_PtrSize(p->pManAig->vObjs), local_2c < iVar3;
          local_2c = local_2c + 1) {
        pvVar7 = Vec_PtrEntry(p->pManAig->vObjs,local_2c);
        if (pvVar7 != (void *)0x0) {
          *(ulong *)((long)pvVar7 + 0x18) = *(ulong *)((long)pvVar7 + 0x18) & 0xffffffffffffffdf;
        }
      }
      return;
    }
    pvVar7 = Vec_PtrEntry(p->pManAig->vObjs,local_2c);
    if ((pvVar7 != (void *)0x0) && ((*(ulong *)((long)pvVar7 + 0x18) >> 5 & 1) != 0)) break;
    local_2c = local_2c + 1;
  }
  __assert_fail("!pObj->fMarkB",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCore.c"
                ,0xc1,"void Fra_FraigVerifyCounterEx(Fra_Man_t *, Vec_Int_t *)");
}

Assistant:

void Fra_FraigVerifyCounterEx( Fra_Man_t * p, Vec_Int_t * vCex )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, c;
    assert( Aig_ManCiNum(p->pManAig) == Vec_IntSize(vCex) );
    // make sure the input pattern is not used
    Aig_ManForEachObj( p->pManAig, pObj, i )
        assert( !pObj->fMarkB );
    // simulate the cex through the AIG
    Aig_ManConst1(p->pManAig)->fMarkB = 1;
    Aig_ManForEachCi( p->pManAig, pObj, i )
        pObj->fMarkB = Vec_IntEntry(vCex, i);
    Aig_ManForEachNode( p->pManAig, pObj, i )
        pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                       (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
    Aig_ManForEachCo( p->pManAig, pObj, i )
        pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
    // check if the classes hold
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pCla->vClasses1, pObj, i )
    {
        if ( pObj->fPhase != pObj->fMarkB )
            printf( "The node %d is not constant under cex!\n", pObj->Id );
    }
    Vec_PtrForEachEntry( Aig_Obj_t **, p->pCla->vClasses, ppClass, i )
    {
        for ( c = 1; ppClass[c]; c++ )
            if ( (ppClass[0]->fPhase ^ ppClass[c]->fPhase) != (ppClass[0]->fMarkB ^ ppClass[c]->fMarkB) )
                printf( "The nodes %d and %d are not equal under cex!\n", ppClass[0]->Id, ppClass[c]->Id );
//        for ( c = 0; ppClass[c]; c++ )
//            if ( Fra_ObjFraig(ppClass[c],p->pPars->nFramesK) == Aig_ManConst1(p->pManFraig) )
//                printf( "A member of non-constant class has a constant repr!\n" );
    }
    // clean the simulation pattern
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->fMarkB = 0;
}